

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O2

void __thiscall deqp::gls::MemObjectAllocator::~MemObjectAllocator(MemObjectAllocator *this)

{
  TextureRenderer::~TextureRenderer(&this->m_textureRenderer);
  BufferRenderer::~BufferRenderer(&this->m_bufferRenderer);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return;
}

Assistant:

MemObjectAllocator::~MemObjectAllocator (void)
{
}